

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3c4::NinjaMain::RebuildManifest
          (NinjaMain *this,char *input_file,string *err,Status *status)

{
  bool bVar1;
  ulong uVar2;
  Node *target;
  undefined1 local_1a0 [8];
  Builder builder;
  Node *node;
  uint64_t slash_bits;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string path;
  Status *status_local;
  string *err_local;
  char *input_file_local;
  NinjaMain *this_local;
  
  path.field_2._8_8_ = status;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,input_file,&local_51);
  std::allocator<char>::~allocator(&local_51);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    CanonicalizePath((string *)local_50,(uint64_t *)&node);
    StringPiece::StringPiece
              ((StringPiece *)&builder.scan_.dyndep_loader_.disk_interface_,(string *)local_50);
    target = State::LookupNode(&this->state_,stack0xffffffffffffff78);
    if (target == (Node *)0x0) {
      this_local._7_1_ = false;
      slash_bits._0_4_ = 1;
    }
    else {
      Builder::Builder((Builder *)local_1a0,&this->state_,this->config_,&this->build_log_,
                       &this->deps_log_,&(this->disk_interface_).super_DiskInterface,
                       (Status *)path.field_2._8_8_,this->start_time_millis_);
      bVar1 = Builder::AddTarget((Builder *)local_1a0,target,err);
      if (bVar1) {
        bVar1 = Builder::AlreadyUpToDate((Builder *)local_1a0);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = Builder::Build((Builder *)local_1a0,err);
          if (bVar1) {
            bVar1 = Node::dirty(target);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              State::Reset(&this->state_);
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
      slash_bits._0_4_ = 1;
      Builder::~Builder((Builder *)local_1a0);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)err,"empty path");
    this_local._7_1_ = false;
    slash_bits._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool NinjaMain::RebuildManifest(const char* input_file, string* err,
                                Status* status) {
  string path = input_file;
  if (path.empty()) {
    *err = "empty path";
    return false;
  }
  uint64_t slash_bits;  // Unused because this path is only used for lookup.
  CanonicalizePath(&path, &slash_bits);
  Node* node = state_.LookupNode(path);
  if (!node)
    return false;

  Builder builder(&state_, config_, &build_log_, &deps_log_, &disk_interface_,
                  status, start_time_millis_);
  if (!builder.AddTarget(node, err))
    return false;

  if (builder.AlreadyUpToDate())
    return false;  // Not an error, but we didn't rebuild.

  if (!builder.Build(err))
    return false;

  // The manifest was only rebuilt if it is now dirty (it may have been cleaned
  // by a restat).
  if (!node->dirty()) {
    // Reset the state to prevent problems like
    // https://github.com/ninja-build/ninja/issues/874
    state_.Reset();
    return false;
  }

  return true;
}